

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT32 __thiscall VGMPlayer::Render(VGMPlayer *this,UINT32 smplCnt,WAVE_32BS *data)

{
  int iVar1;
  uint uVar2;
  pointer pDVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  pointer pCVar7;
  UINT32 smplCount;
  ulong uVar8;
  
  uVar4 = 0;
  while( true ) {
    iVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)this->_playSmpl);
    ParseFile(this,iVar1 - this->_playTick);
    iVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_fileTick);
    uVar2 = iVar1 - this->_playSmpl;
    if (((int)uVar2 < 1) ||
       ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar2 = 1;
    }
    smplCount = smplCnt - (int)uVar4;
    if (uVar2 < smplCount) {
      smplCount = uVar2;
    }
    pCVar7 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devices).
        super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar7) {
      uVar5 = 0;
      do {
        if (pCVar7[uVar5].optID == 0xffffffffffffffff) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)this->_devOpts[pCVar7[uVar5].optID].muteOpts.disable;
        }
        if (pCVar7 != (pointer)0x0) {
          pCVar7 = pCVar7 + uVar5;
          do {
            if (((pCVar7->base).defInf.dataPtr != (DEV_DATA *)0x0) && ((uVar8 & 1) == 0)) {
              Resmpl_Execute(&(pCVar7->base).resmpl,smplCount,data + uVar4);
            }
            pCVar7 = (pointer)(pCVar7->base).linkDev;
            uVar8 = uVar8 >> 1;
          } while (pCVar7 != (pointer)0x0);
        }
        uVar5 = uVar5 + 1;
        pCVar7 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)(((long)(this->_devices).
                                      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 4
                               ) * -0x1111111111111111));
    }
    pDVar3 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish != pDVar3) {
      lVar6 = 0x10;
      uVar5 = 0;
      do {
        (**(code **)(*(long *)((long)&(pDVar3->defInf).dataPtr + lVar6) + 0x30))
                  (*(undefined8 *)((long)pDVar3 + lVar6 + -0x10),smplCount,0);
        uVar5 = uVar5 + 1;
        pDVar3 = (this->_dacStreams).
                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x38;
      } while (uVar5 < (ulong)(((long)(this->_dacStreams).
                                      super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 3
                               ) * 0x6db6db6db6db6db7));
    }
    this->_playSmpl = this->_playSmpl + smplCount;
    uVar2 = (int)uVar4 + smplCount;
    uVar4 = (ulong)uVar2;
    if ((this->_psTrigger & 2) != 0) break;
    if (smplCnt <= uVar2) {
      return uVar2;
    }
  }
  this->_psTrigger = this->_psTrigger & 0xfd;
  return uVar2;
}

Assistant:

UINT32 VGMPlayer::Render(UINT32 smplCnt, WAVE_32BS* data)
{
	UINT32 curSmpl;
	UINT32 smplFileTick;
	UINT32 maxSmpl;
	INT32 smplStep;	// might be negative due to rounding errors in Tick2Sample
	size_t curDev;
	
	// Note: use do {} while(), so that "smplCnt == 0" can be used to process until reaching the next sample.
	curSmpl = 0;
	do
	{
		smplFileTick = Sample2Tick(_playSmpl);
		ParseFile(smplFileTick - _playTick);
		
		// render as many samples at once as possible (for better performance)
		maxSmpl = Tick2Sample(_fileTick);
		smplStep = maxSmpl - _playSmpl;
		// When DAC streams are active, limit step size to 1, so that DAC streams and sound chip emulation are in sync.
		if (smplStep < 1 || ! _dacStreams.empty())
			smplStep = 1;	// must render at least 1 sample in order to advance
		if ((UINT32)smplStep > smplCnt - curSmpl)
			smplStep = smplCnt - curSmpl;
		
		for (curDev = 0; curDev < _devices.size(); curDev ++)
		{
			CHIP_DEVICE* cDev = &_devices[curDev];
			UINT8 disable = (cDev->optID != (size_t)-1) ? _devOpts[cDev->optID].muteOpts.disable : 0x00;
			VGM_BASEDEV* clDev;
			
			for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev, disable >>= 1)
			{
				if (clDev->defInf.dataPtr != NULL && ! (disable & 0x01))
					Resmpl_Execute(&clDev->resmpl, smplStep, &data[curSmpl]);
			}
		}
		for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
		{
			DEV_INFO* dacDInf = &_dacStreams[curDev].defInf;
			dacDInf->devDef->Update(dacDInf->dataPtr, smplStep, NULL);
		}
		
		curSmpl += smplStep;
		_playSmpl += smplStep;
		if (_psTrigger & PLAYSTATE_END)
		{
			_psTrigger &= ~PLAYSTATE_END;
			break;
		}
	} while(curSmpl < smplCnt);
	
	return curSmpl;
}